

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteNLHeader
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  NLHeader *pNVar9;
  char *format;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *in_RDI;
  char *fmt;
  char *s;
  int i;
  uint local_12c;
  char *local_108;
  File *this_00;
  char local_21;
  char *local_18;
  int local_c;
  
  pNVar9 = Hdr(in_RDI);
  local_21 = 'g';
  if ((pNVar9->super_NLInfo).super_NLInfo_C.format != 0) {
    local_21 = 'b';
  }
  pNVar9 = Hdr(in_RDI);
  File::Printf(&in_RDI->nm,"%c%d",(ulong)(uint)(int)local_21,
               (ulong)(uint)(pNVar9->super_NLInfo).super_NLInfo_C.num_ampl_options);
  for (local_c = 0; pNVar9 = Hdr(in_RDI),
      local_c < (pNVar9->super_NLInfo).super_NLInfo_C.num_ampl_options; local_c = local_c + 1) {
    pNVar9 = Hdr(in_RDI);
    File::Printf(&in_RDI->nm," %ld",(pNVar9->super_NLInfo).super_NLInfo_C.ampl_options[local_c]);
  }
  pNVar9 = Hdr(in_RDI);
  if ((pNVar9->super_NLInfo).super_NLInfo_C.ampl_options[1] == 3) {
    pNVar9 = Hdr(in_RDI);
    File::Printf((File *)(pNVar9->super_NLInfo).super_NLInfo_C.ampl_vbtol,(char *)&in_RDI->nm," %.g"
                );
  }
  pNVar9 = Hdr(in_RDI);
  File::Printf(&in_RDI->nm,"\t# problem %s\n",(pNVar9->super_NLInfo).super_NLInfo_C.prob_name);
  pNVar9 = Hdr(in_RDI);
  uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  pNVar9 = Hdr(in_RDI);
  uVar2 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons;
  pNVar9 = Hdr(in_RDI);
  uVar3 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_objs;
  pNVar9 = Hdr(in_RDI);
  uVar4 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_ranges;
  pNVar9 = Hdr(in_RDI);
  File::Printf(&in_RDI->nm," %d %d %d %d %d",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
               (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_eqns);
  local_18 = "";
  pNVar9 = Hdr(in_RDI);
  if ((pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_vars == 0) {
    pNVar9 = Hdr(in_RDI);
    if ((pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons != 0) {
      local_18 = ", lcons";
      pNVar9 = Hdr(in_RDI);
      File::Printf(&in_RDI->nm," %d",
                   (ulong)(uint)(pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons
                  );
    }
  }
  else {
    local_18 = ", lcons, randvars";
    pNVar9 = Hdr(in_RDI);
    uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons;
    pNVar9 = Hdr(in_RDI);
    File::Printf(&in_RDI->nm," %d %d",(ulong)uVar1,
                 (ulong)(uint)(pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_vars);
  }
  File::Printf(&in_RDI->nm,"\t# vars, algcons, objs, ranges, eqns%s\n",local_18);
  pNVar9 = Hdr(in_RDI);
  iVar5 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_conds;
  pNVar9 = Hdr(in_RDI);
  iVar6 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_cons;
  pNVar9 = Hdr(in_RDI);
  if ((iVar5 == 0 && iVar6 == 0) &&
      (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_objs == 0) {
    pNVar9 = Hdr(in_RDI);
    uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_cons;
    pNVar9 = Hdr(in_RDI);
    File::Printf(&in_RDI->nm," %d %d\t# nonlinear cons, objs\n",(ulong)uVar1,
                 (ulong)(uint)(pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_objs);
  }
  else {
    pNVar9 = Hdr(in_RDI);
    uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_cons;
    pNVar9 = Hdr(in_RDI);
    uVar2 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_objs;
    pNVar9 = Hdr(in_RDI);
    iVar5 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_conds;
    pNVar9 = Hdr(in_RDI);
    iVar6 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_compl_conds;
    pNVar9 = Hdr(in_RDI);
    uVar3 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_compl_conds;
    pNVar9 = Hdr(in_RDI);
    iVar7 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_dbl_ineqs;
    pNVar9 = Hdr(in_RDI);
    File::Printf(&in_RDI->nm," %d %d %d %d %d %d",(ulong)uVar1,(ulong)uVar2,
                 (ulong)(uint)(iVar5 - iVar6),(ulong)uVar3,iVar7,
                 (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_vars_with_nz_lb);
    local_18 = "";
    pNVar9 = Hdr(in_RDI);
    iVar5 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_cons;
    pNVar9 = Hdr(in_RDI);
    if (iVar5 != 0 || (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_objs != 0) {
      pNVar9 = Hdr(in_RDI);
      uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_cons;
      pNVar9 = Hdr(in_RDI);
      File::Printf(&in_RDI->nm," %d %d",(ulong)uVar1,
                   (ulong)(uint)(pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_objs);
      local_18 = "; rand constrs, objs";
    }
    File::Printf(&in_RDI->nm,"\t# nonlinear cons, objs; compl: lin, nonlin, range, nzlb%s\n",
                 local_18);
  }
  pNVar9 = Hdr(in_RDI);
  uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_net_cons;
  pNVar9 = Hdr(in_RDI);
  File::Printf(&in_RDI->nm," %d %d",(ulong)uVar1,
               (ulong)(uint)(pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_cons)
  ;
  pNVar9 = Hdr(in_RDI);
  format = "\t# network cons: nonlinear, linear\n";
  if (1 < (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_stages) {
    format = " %d\t# network cons: nonlinear, linear; stages\n";
  }
  pNVar9 = Hdr(in_RDI);
  File::Printf(&in_RDI->nm,format,
               (ulong)(uint)(pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_stages);
  this_00 = &in_RDI->nm;
  pNVar9 = Hdr(in_RDI);
  uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons;
  pNVar9 = Hdr(in_RDI);
  uVar2 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs;
  pNVar9 = Hdr(in_RDI);
  File::Printf(this_00," %d %d %d\t# nonlinear vars in cons, objs, both\n",(ulong)uVar1,(ulong)uVar2
               ,(ulong)(uint)(pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both
              );
  pNVar9 = Hdr(in_RDI);
  if ((pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_vars == 0) {
    pNVar9 = Hdr(in_RDI);
    iVar5 = (pNVar9->super_NLInfo).super_NLInfo_C.flags;
    pNVar9 = Hdr(in_RDI);
    local_108 = " %d %d\t# linear network vars; funcs\n";
    if (iVar5 != 0 || (pNVar9->super_NLInfo).super_NLInfo_C.arith_kind != 0) {
      local_108 = " %d %d %d %d\t# linear network vars; funcs; arith, flags\n";
    }
  }
  else {
    local_108 = " %d %d %d %d %d\t# linear network vars; funcs; arith, flags; randcalls\n";
  }
  pNVar9 = Hdr(in_RDI);
  uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_vars;
  pNVar9 = Hdr(in_RDI);
  uVar2 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs;
  pNVar9 = Hdr(in_RDI);
  if ((pNVar9->super_NLInfo).super_NLInfo_C.format == 0) {
    local_12c = 0;
  }
  else {
    pNVar9 = Hdr(in_RDI);
    local_12c = (pNVar9->super_NLInfo).super_NLInfo_C.arith_kind;
  }
  pNVar9 = Hdr(in_RDI);
  uVar3 = (pNVar9->super_NLInfo).super_NLInfo_C.flags;
  pNVar9 = Hdr(in_RDI);
  File::Printf(&in_RDI->nm,local_108,(ulong)uVar1,(ulong)uVar2,(ulong)local_12c,(ulong)uVar3,
               (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_calls);
  pNVar9 = Hdr(in_RDI);
  uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars;
  pNVar9 = Hdr(in_RDI);
  uVar2 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars;
  pNVar9 = Hdr(in_RDI);
  uVar3 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both;
  pNVar9 = Hdr(in_RDI);
  uVar4 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons;
  pNVar9 = Hdr(in_RDI);
  File::Printf(&in_RDI->nm," %d %d %d %d %d\t# discrete vars: binary, integer, nonlinear (b,c,o)\n",
               (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
               (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs);
  pNVar9 = Hdr(in_RDI);
  sVar8 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_con_nonzeros;
  pNVar9 = Hdr(in_RDI);
  File::Printf(&in_RDI->nm," %zd %zd\t# nonzeros in Jacobian, gradients\n",sVar8,
               (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_obj_nonzeros);
  pNVar9 = Hdr(in_RDI);
  uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.max_con_name_len;
  pNVar9 = Hdr(in_RDI);
  File::Printf(&in_RDI->nm," %d %d\t# max name lengths: cons/objs, vars\n",(ulong)uVar1,
               (ulong)(uint)(pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.max_var_name_len);
  pNVar9 = Hdr(in_RDI);
  uVar1 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both;
  pNVar9 = Hdr(in_RDI);
  uVar2 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons;
  pNVar9 = Hdr(in_RDI);
  uVar3 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs;
  pNVar9 = Hdr(in_RDI);
  uVar4 = (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons;
  pNVar9 = Hdr(in_RDI);
  File::Printf(&in_RDI->nm," %d %d %d %d %d",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
               (pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs);
  local_18 = "";
  pNVar9 = Hdr(in_RDI);
  if ((pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.num_rand_common_exprs != 0) {
    pNVar9 = Hdr(in_RDI);
    File::Printf(&in_RDI->nm," %d",
                 (ulong)(uint)(pNVar9->super_NLProblemInfo).super_NLProblemInfo_C.
                              num_rand_common_exprs);
    local_18 = ",rand";
  }
  File::Printf(&in_RDI->nm,"\t# common exprs: b,c,o,c1,o1%s\n",local_18);
  return;
}

Assistant:

void NLWriter2<Params>::WriteNLHeader() {
  assert(Formatter().Mode() == Hdr().format);

  /// But the header is always text.
  nm.Printf(gl_1__short,
            NLHeader::TEXT==Hdr().format ? 'g' : 'b',
            Hdr().num_ampl_options);
  for (int i = 0; i < Hdr().num_ampl_options; ++i)
    nm.Printf(" %ld", Hdr().ampl_options[i]);
  if (Hdr().ampl_options[VBTOL_OPTION_INDEX] == USE_VBTOL_FLAG)
    nm.Printf(" %.g", Hdr().ampl_vbtol);
  nm.Printf(gl_1a, Hdr().prob_name);

  /// Num variables, constraints, obj, ...
  nm.Printf(gl_2a,
            Hdr().num_vars,
            Hdr().num_algebraic_cons,
            Hdr().num_objs,
            Hdr().num_ranges,
            Hdr().num_eqns);
  const char* s = "";
  if (Hdr().num_rand_vars) {            /*SNL2006*/
    s = ", lcons, randvars";
    nm.Printf(" %d %d",
              Hdr().num_logical_cons,
              Hdr().num_rand_vars);
  }
  else if (Hdr().num_logical_cons) {
    s = ", lcons";
    nm.Printf(" %d", Hdr().num_logical_cons);
  }
  nm.Printf(gl_2, s);

  /// Nonlinear / random cons/obj
  if (Hdr().num_compl_conds |
      Hdr().num_rand_cons | Hdr().num_rand_objs) {
    nm.Printf(" %d %d %d %d %d %d",
              Hdr().num_nl_cons, Hdr().num_nl_objs,
              Hdr().num_compl_conds - Hdr().num_nl_compl_conds,
              Hdr().num_nl_compl_conds, Hdr().num_compl_dbl_ineqs,
              Hdr().num_compl_vars_with_nz_lb);
    s = "";
    if (Hdr().num_rand_cons | Hdr().num_rand_objs) {
      nm.Printf(" %d %d",
                Hdr().num_rand_cons, Hdr().num_rand_objs);
      s = "; rand constrs, objs";
    }
    nm.Printf(gl_3c, s);
  }
  else
    nm.Printf(gl_3, Hdr().num_nl_cons, Hdr().num_nl_objs);

  /// Network cons, stages
  nm.Printf(" %d %d",
            Hdr().num_nl_net_cons, Hdr().num_linear_net_cons);
  nm.Printf(Hdr().num_stages > 1 ? gl_4r : gl_4,
            Hdr().num_stages);

  /// NL vars in cons, objs, both
  nm.Printf(gl_5, Hdr().num_nl_vars_in_cons,
            Hdr().num_nl_vars_in_objs, Hdr().num_nl_vars_in_both);

  /// Linear network vars, functions, ak, flags, rnd calls
  const char* fmt =
      Hdr().num_rand_vars ? gl_6y :
                            Hdr().flags | Hdr().arith_kind ?
                              gl_6x : gl_6;
  nm.Printf(fmt, Hdr().num_linear_net_vars, Hdr().num_funcs,
            NLHeader::TEXT==Hdr().format ? 0 : Hdr().arith_kind,
            Hdr().flags, Hdr().num_rand_calls);

  /// Integer vars
  nm.Printf(gl_7, Hdr().num_linear_binary_vars,
            Hdr().num_linear_integer_vars,
            Hdr().num_nl_integer_vars_in_both,
            Hdr().num_nl_integer_vars_in_cons,
            Hdr().num_nl_integer_vars_in_objs);

  /// Nonzeros
  nm.Printf(gl_8, Hdr().num_con_nonzeros,
            Hdr().num_obj_nonzeros);

  /// Max name lengths
  nm.Printf(gl_9, Hdr().max_con_name_len,
            Hdr().max_var_name_len);

  /// Common exprs
  nm.Printf(" %d %d %d %d %d",
            Hdr().num_common_exprs_in_both,
            Hdr().num_common_exprs_in_cons,
            Hdr().num_common_exprs_in_objs,
            Hdr().num_common_exprs_in_single_cons,
            Hdr().num_common_exprs_in_single_objs);
  s = "";
  if (Hdr().num_rand_common_exprs) {       /*SNL2006*/
    nm.Printf(" %d", Hdr().num_rand_common_exprs);
    s = ",rand";
  }
  nm.Printf(gl_10, s);
}